

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O0

uint ON_GetVersionString(uint major_version,uint minor_version,uint year,uint month,
                        uint day_of_month,uint hour,uint minute,uint branch,
                        size_t string_buffer_capacity,char *string_buffer)

{
  uint uVar1;
  unsigned_short local_54 [2];
  uint version_number;
  unsigned_short quartet_values [4];
  uint j;
  uint i;
  uint string_length;
  size_t s_capacity;
  char s [24];
  uint hour_local;
  uint day_of_month_local;
  uint month_local;
  uint year_local;
  uint minor_version_local;
  uint major_version_local;
  
  s._16_4_ = hour;
  s._20_4_ = day_of_month;
  memset(&s_capacity,0,0x18);
  j = 0;
  memset(local_54,0,8);
  uVar1 = ON_GetVersionQuartet
                    (major_version,minor_version,year,month,s._20_4_,s._16_4_,minute,branch,local_54
                    );
  if ((string_buffer_capacity == 0) || (string_buffer == (char *)0x0)) {
    string_buffer_capacity = 0x18;
    string_buffer = (char *)&s_capacity;
  }
  if (uVar1 != 0) {
    quartet_values[2] = 0;
    quartet_values[3] = 0;
    for (; (uint)quartet_values._4_4_ < 4 && j < string_buffer_capacity;
        quartet_values._4_4_ = quartet_values._4_4_ + 1) {
      if (quartet_values._4_4_ != 0) {
        string_buffer[j] = '.';
        j = j + 1;
      }
      uVar1 = AppendValueToString((uint)local_54[(uint)quartet_values._4_4_],
                                  string_buffer_capacity - j,string_buffer + j);
      quartet_values[0] = (short)uVar1;
      quartet_values[1] = (short)(uVar1 >> 0x10);
      if (uVar1 == 0) {
        j = 0;
        break;
      }
      j = uVar1 + j;
    }
  }
  if (string_buffer_capacity < j) {
    j = 0;
  }
  quartet_values[2] = (undefined2)j;
  quartet_values[3] = j._2_2_;
  for (; (uint)quartet_values._4_4_ < string_buffer_capacity;
      quartet_values._4_4_ = quartet_values._4_4_ + 1) {
    string_buffer[(uint)quartet_values._4_4_] = '\0';
  }
  return j;
}

Assistant:

unsigned int ON_GetVersionString(
  unsigned int major_version,
  unsigned int minor_version,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int hour,
  unsigned int minute,
  unsigned int branch,
  size_t string_buffer_capacity,
  char* string_buffer
  )
{
  char s[24] = {0};
  const size_t s_capacity = sizeof(s)/sizeof(s[0]);
  unsigned int string_length = 0;
  unsigned int i, j;
  unsigned short quartet_values[4] = {0};
  unsigned int version_number = ON_GetVersionQuartet(
                                      major_version,
                                      minor_version,
                                      year,
                                      month,
                                      day_of_month,
                                      hour,
                                      minute,
                                      branch,
                                      quartet_values
                                      );

  if (string_buffer_capacity <= 0 || nullptr == string_buffer)
  {
    string_buffer_capacity = s_capacity;
    string_buffer = s;
  }

  if ( version_number > 0 )
  {
    for(i = 0; i < 4 && string_length < string_buffer_capacity; i++ )
    {
      if ( i > 0 )
        string_buffer[string_length++] = '.';

      j = AppendValueToString(
        quartet_values[i],
        string_buffer_capacity - string_length,
        string_buffer + string_length
        );

      if ( j <= 0 )
      {
        string_length = 0;
        break;
      }

      string_length += j;

    }
  }

  if ( string_length > string_buffer_capacity )
    string_length = 0;

  for ( i = string_length; i < string_buffer_capacity; i++ )
    string_buffer[i] = 0;

  return string_length;
}